

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O1

OSToken * OSToken::createToken
                    (string *basePath,string *tokenDir,int umask,ByteString *label,
                    ByteString *serial)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  OSToken *this;
  undefined8 *puVar6;
  unsigned_long *puVar7;
  size_type *psVar8;
  long *plVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  OSAttribute tokenFlags;
  OSAttribute tokenLabel;
  OSAttribute tokenSerial;
  Directory baseDir;
  ObjectFile tokenObject;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  string local_490;
  ByteString *local_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  string local_3e8;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  OSAttribute local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  OSAttribute local_2a8;
  string local_208;
  OSAttribute local_1e8;
  Directory local_148;
  ObjectFile local_e0;
  
  pcVar2 = (basePath->_M_dataplus)._M_p;
  local_470 = serial;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar2,pcVar2 + basePath->_M_string_length);
  Directory::Directory(&local_148,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  bVar3 = Directory::isValid(&local_148);
  if (!bVar3) {
    this = (OSToken *)0x0;
    softHSMLog(3,"createToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x4d,"Could not create the Directory object");
    goto LAB_0016c2cb;
  }
  pcVar2 = (tokenDir->_M_dataplus)._M_p;
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_388,pcVar2,pcVar2 + tokenDir->_M_string_length);
  iVar4 = Directory::mkdir(&local_148,(char *)local_388,umask);
  if (local_388[0] != local_378) {
    operator_delete(local_388[0]);
  }
  if ((char)iVar4 == '\0') {
    this = (OSToken *)0x0;
    goto LAB_0016c2cb;
  }
  local_368._vptr_OSAttribute = (_func_int **)&local_368.ulongValue;
  pcVar2 = (basePath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,pcVar2,pcVar2 + basePath->_M_string_length);
  std::__cxx11::string::append((char *)&local_368);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_368,(ulong)(tokenDir->_M_dataplus)._M_p);
  local_1e8._vptr_OSAttribute = (_func_int **)&local_1e8.ulongValue;
  puVar7 = (unsigned_long *)(plVar5 + 2);
  if ((unsigned_long *)*plVar5 == puVar7) {
    local_1e8.ulongValue = *puVar7;
    local_1e8.byteStrValue._vptr_ByteString = (_func_int **)plVar5[3];
  }
  else {
    local_1e8.ulongValue = *puVar7;
    local_1e8._vptr_OSAttribute = (_func_int **)*plVar5;
  }
  local_1e8._8_8_ = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_2a8._vptr_OSAttribute = (_func_int **)&local_2a8.ulongValue;
  puVar7 = (unsigned_long *)(plVar5 + 2);
  if ((unsigned_long *)*plVar5 == puVar7) {
    local_2a8.ulongValue = *puVar7;
    local_2a8.byteStrValue._vptr_ByteString = (_func_int **)plVar5[3];
  }
  else {
    local_2a8.ulongValue = *puVar7;
    local_2a8._vptr_OSAttribute = (_func_int **)*plVar5;
  }
  local_2a8._8_8_ = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_490.field_2._M_allocated_capacity = *psVar8;
    local_490.field_2._8_4_ = (undefined4)plVar5[3];
    local_490.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
  }
  else {
    local_490.field_2._M_allocated_capacity = *psVar8;
    local_490._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_490._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar2 = (basePath->_M_dataplus)._M_p;
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_448,pcVar2,pcVar2 + basePath->_M_string_length);
  std::__cxx11::string::append((char *)local_448);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_448,(ulong)(tokenDir->_M_dataplus)._M_p);
  local_468 = &local_458;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_458 = *plVar9;
    lStack_450 = plVar5[3];
  }
  else {
    local_458 = *plVar9;
    local_468 = (long *)*plVar5;
  }
  local_460 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_468);
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_4b0.field_2._M_allocated_capacity = *psVar8;
    local_4b0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_4b0.field_2._M_allocated_capacity = *psVar8;
    local_4b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_4b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4b0);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_3e8.field_2._M_allocated_capacity = *psVar8;
    local_3e8.field_2._8_8_ = plVar5[3];
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  }
  else {
    local_3e8.field_2._M_allocated_capacity = *psVar8;
    local_3e8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_3e8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ObjectFile::ObjectFile(&local_e0,(OSToken *)0x0,&local_490,umask,&local_3e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  paVar1 = &local_4b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468);
  }
  if (local_448[0] != local_438) {
    operator_delete(local_448[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if (local_2a8._vptr_OSAttribute != (_func_int **)&local_2a8.ulongValue) {
    operator_delete(local_2a8._vptr_OSAttribute);
  }
  if (local_1e8._vptr_OSAttribute != (_func_int **)&local_1e8.ulongValue) {
    operator_delete(local_1e8._vptr_OSAttribute);
  }
  if (local_368._vptr_OSAttribute != (_func_int **)&local_368.ulongValue) {
    operator_delete(local_368._vptr_OSAttribute);
  }
  if (local_e0.valid == false) {
    pcVar2 = (basePath->_M_dataplus)._M_p;
    local_4b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4b0,pcVar2,pcVar2 + basePath->_M_string_length);
    std::__cxx11::string::append((char *)&local_4b0);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_4b0,(ulong)(tokenDir->_M_dataplus)._M_p);
    puVar7 = (unsigned_long *)(plVar5 + 2);
    if ((unsigned_long *)*plVar5 == puVar7) {
      local_368.ulongValue = *puVar7;
      local_368.byteStrValue._vptr_ByteString = (_func_int **)plVar5[3];
      local_368._vptr_OSAttribute = (_func_int **)&local_368.ulongValue;
    }
    else {
      local_368.ulongValue = *puVar7;
      local_368._vptr_OSAttribute = (_func_int **)*plVar5;
    }
    local_368._8_8_ = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_368);
    puVar7 = puVar6 + 2;
    if ((unsigned_long *)*puVar6 == puVar7) {
      local_1e8.ulongValue = *puVar7;
      local_1e8.byteStrValue._vptr_ByteString = (_func_int **)puVar6[3];
      local_1e8._vptr_OSAttribute = (_func_int **)&local_1e8.ulongValue;
    }
    else {
      local_1e8.ulongValue = *puVar7;
      local_1e8._vptr_OSAttribute = (_func_int **)*puVar6;
    }
    local_1e8._8_8_ = puVar6[1];
    *puVar6 = puVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar7 = puVar6 + 2;
    if ((unsigned_long *)*puVar6 == puVar7) {
      local_2a8.ulongValue = *puVar7;
      local_2a8.byteStrValue._vptr_ByteString = (_func_int **)puVar6[3];
      local_2a8._vptr_OSAttribute = (_func_int **)&local_2a8.ulongValue;
    }
    else {
      local_2a8.ulongValue = *puVar7;
      local_2a8._vptr_OSAttribute = (_func_int **)*puVar6;
    }
    local_2a8._8_8_ = puVar6[1];
    *puVar6 = puVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if (local_1e8._vptr_OSAttribute != (_func_int **)&local_1e8.ulongValue) {
      operator_delete(local_1e8._vptr_OSAttribute);
    }
    if (local_368._vptr_OSAttribute != (_func_int **)&local_368.ulongValue) {
      operator_delete(local_368._vptr_OSAttribute);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4b0._M_dataplus._M_p);
    }
    softHSMLog(3,"createToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x5e,"Failed to create the token object: %s",local_2a8._vptr_OSAttribute);
    pcVar2 = (tokenDir->_M_dataplus)._M_p;
    local_3a8[0] = local_398;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3a8,pcVar2,pcVar2 + tokenDir->_M_string_length);
    Directory::rmdir(&local_148,(char *)local_3a8);
    if (local_3a8[0] != local_398) {
      operator_delete(local_3a8[0]);
    }
    if (local_2a8._vptr_OSAttribute != (_func_int **)&local_2a8.ulongValue) {
      operator_delete(local_2a8._vptr_OSAttribute);
    }
    this = (OSToken *)0x0;
  }
  else {
    OSAttribute::OSAttribute(&local_2a8,label);
    OSAttribute::OSAttribute(&local_1e8,local_470);
    OSAttribute::OSAttribute(&local_368,0xc00425);
    bVar3 = ObjectFile::setAttribute(&local_e0,0x80005349,&local_2a8);
    if (bVar3) {
      bVar3 = ObjectFile::setAttribute(&local_e0,0x8000534a,&local_1e8);
      if (!bVar3) goto LAB_0016befb;
      bVar3 = ObjectFile::setAttribute(&local_e0,0x8000534b,&local_368);
      if (!bVar3) goto LAB_0016befb;
      softHSMLog(7,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x7f,"Created new token %s",(tokenDir->_M_dataplus)._M_p);
      this = (OSToken *)operator_new(0xe8);
      std::operator+(&local_4b0,basePath,"/");
      std::operator+(&local_2c8,&local_4b0,tokenDir);
      OSToken(this,&local_2c8,umask);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_4b0._M_dataplus._M_p);
      }
    }
    else {
LAB_0016befb:
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x76,"Failed to set the token attributes");
      pcVar2 = (tokenDir->_M_dataplus)._M_p;
      local_4b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4b0,pcVar2,pcVar2 + tokenDir->_M_string_length);
      std::__cxx11::string::append((char *)&local_4b0);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_4b0);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3f8 = *plVar9;
        lStack_3f0 = plVar5[3];
        local_408 = &local_3f8;
      }
      else {
        local_3f8 = *plVar9;
        local_408 = (long *)*plVar5;
      }
      local_400 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      Directory::remove(&local_148,(char *)&local_408);
      if (local_408 != &local_3f8) {
        operator_delete(local_408);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_4b0._M_dataplus._M_p);
      }
      pcVar2 = (tokenDir->_M_dataplus)._M_p;
      local_4b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4b0,pcVar2,pcVar2 + tokenDir->_M_string_length);
      std::__cxx11::string::append((char *)&local_4b0);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_4b0);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_418 = *plVar9;
        lStack_410 = plVar5[3];
        local_428 = &local_418;
      }
      else {
        local_418 = *plVar9;
        local_428 = (long *)*plVar5;
      }
      local_420 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      Directory::remove(&local_148,(char *)&local_428);
      if (local_428 != &local_418) {
        operator_delete(local_428);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_4b0._M_dataplus._M_p);
      }
      pcVar2 = (tokenDir->_M_dataplus)._M_p;
      local_3c8[0] = local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c8,pcVar2,pcVar2 + tokenDir->_M_string_length);
      Directory::rmdir(&local_148,(char *)local_3c8);
      if (local_3c8[0] != local_3b8) {
        operator_delete(local_3c8[0]);
      }
      this = (OSToken *)0x0;
    }
    OSAttribute::~OSAttribute(&local_368);
    OSAttribute::~OSAttribute(&local_1e8);
    OSAttribute::~OSAttribute(&local_2a8);
  }
  ObjectFile::~ObjectFile(&local_e0);
LAB_0016c2cb:
  Directory::~Directory(&local_148);
  return this;
}

Assistant:

OSToken* OSToken::createToken(const std::string basePath, const std::string tokenDir, int umask, const ByteString& label, const ByteString& serial)
{
	Directory baseDir(basePath);

	if (!baseDir.isValid())
	{
		ERROR_MSG("Could not create the Directory object");
		return NULL;
	}

	// Create the token directory
	if (!baseDir.mkdir(tokenDir, umask))
	{
		// Error msg is generated by mkdir
		return NULL;
	}

	// Create the token object
	ObjectFile tokenObject(NULL, basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.object", umask, basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.lock", true);

	if (!tokenObject.valid)
	{
		std::string tokenPath = basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.[object|lock]";
		ERROR_MSG("Failed to create the token object: %s", tokenPath.c_str());

		baseDir.rmdir(tokenDir);

		return NULL;
	}

	// Set the initial attributes
	CK_ULONG flags =
		CKF_RNG |
		CKF_LOGIN_REQUIRED | // FIXME: check
		CKF_RESTORE_KEY_NOT_NEEDED |
		CKF_TOKEN_INITIALIZED |
		CKF_SO_PIN_LOCKED |
		CKF_SO_PIN_TO_BE_CHANGED;

	OSAttribute tokenLabel(label);
	OSAttribute tokenSerial(serial);
	OSAttribute tokenFlags(flags);

	if (!tokenObject.setAttribute(CKA_OS_TOKENLABEL, tokenLabel) ||
	    !tokenObject.setAttribute(CKA_OS_TOKENSERIAL, tokenSerial) ||
	    !tokenObject.setAttribute(CKA_OS_TOKENFLAGS, tokenFlags))
	{
		ERROR_MSG("Failed to set the token attributes");

		baseDir.remove(tokenDir + OS_PATHSEP + "token.object");
		baseDir.remove(tokenDir + OS_PATHSEP + "token.lock");
		baseDir.rmdir(tokenDir);

		return NULL;
	}

	DEBUG_MSG("Created new token %s", tokenDir.c_str());

	return new OSToken(basePath + OS_PATHSEP + tokenDir, umask);
}